

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestValidations::Run(ParserTestValidations *this)

{
  Edge *pEVar1;
  Test *this_00;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  StringPiece path;
  
  iVar3 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild foo: cat bar |@ baz\n");
  if (iVar3 == g_current_test->assertion_failures_) {
    path.len_ = 3;
    path.str_ = "foo";
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,path);
    pEVar1 = pNVar4->in_edge_;
    bVar2 = testing::Test::Check
                      (g_current_test,
                       (long)(pEVar1->validations_).
                             super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pEVar1->validations_).
                             super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Vector_impl_data._M_start == 8,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                       ,0x3ce,"edge->validations_.size() == 1");
    this_00 = g_current_test;
    if (bVar2) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)*(pEVar1->validations_).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start);
      testing::Test::Check
                (this_00,iVar3 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x3cf,"edge->validations_[0]->path() == \"baz\"");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Validations) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build foo: cat bar |@ baz\n"));

  Edge* edge = state.LookupNode("foo")->in_edge();
  ASSERT_EQ(edge->validations_.size(), 1);
  EXPECT_EQ(edge->validations_[0]->path(), "baz");
}